

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol
          (IfcTerminatorSymbol *this,void **vtt)

{
  void **vtt_local;
  IfcTerminatorSymbol *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTerminatorSymbol,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTerminatorSymbol,_1UL> *)
             &(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90,
             vtt + 0x17);
  IfcAnnotationSymbolOccurrence::~IfcAnnotationSymbolOccurrence
            (&this->super_IfcAnnotationSymbolOccurrence,vtt + 1);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}